

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_State_PDU.cpp
# Opt level: O3

KString * __thiscall
KDIS::PDU::Entity_State_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Entity_State_PDU *this)

{
  ostream *poVar1;
  pointer pKVar2;
  KString *pKVar3;
  ostream *poVar4;
  ulong uVar5;
  KINT32 Value;
  ushort uVar6;
  pointer pKVar7;
  KStringStream ss;
  KString local_4c8;
  KString *local_4a8;
  KString local_4a0;
  KString local_480;
  KString local_460;
  KString local_440;
  KString local_420;
  KString local_400;
  KString local_3e0;
  KString local_3c0;
  KString local_3a0;
  long *local_380;
  long local_378;
  long local_370 [2];
  KString local_360;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_360,&this->super_Header);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_360._M_dataplus._M_p,local_360._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-Entity State PDU-\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Entity ID:\n",0xb);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_4a0,&this->m_EntityID);
  local_4a8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar1 = (ostream *)(local_340 + 0x10);
  local_4c8._M_dataplus._M_p._0_1_ = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_4c8,1);
  if (local_4a0._M_string_length != 0) {
    uVar6 = 1;
    uVar5 = 0;
    do {
      local_4c8._M_dataplus._M_p._0_1_ = local_4a0._M_dataplus._M_p[uVar5];
      if ((local_4a0._M_string_length - 1 == uVar5) || ((char)local_4c8._M_dataplus._M_p != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_4c8,1);
      }
      else {
        local_4c8._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_4c8,1);
        local_4c8._M_dataplus._M_p._0_1_ = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_4c8,1);
      }
      uVar5 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar5 < local_4a0._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_380,local_378);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Force ID:                       ",0x20)
  ;
  DATA_TYPE::ENUMS::GetEnumAsStringForceID_abi_cxx11_
            ((KString *)local_340,(ENUMS *)(ulong)this->m_ui8ForceID,Value);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Number Of Variable Params:  ",0x1c);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Entity Type:                    ",0x20)
  ;
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_4c8,&this->m_EntityType);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,
                                              (char)local_4c8._M_dataplus._M_p),
                      local_4c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Alternative Entity Type:        ",0x20)
  ;
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_3a0,&this->m_AltEntityType);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Linear Velocity:                ",0x20)
  ;
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_3c0,&this->m_EntityLinearVelocity);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_3c0._M_dataplus._M_p,local_3c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Entity Location:                ",0x20)
  ;
  DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_(&local_3e0,&this->m_EntityLocation);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_3e0._M_dataplus._M_p,local_3e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Entity Orientation:             ",0x20)
  ;
  DATA_TYPE::EulerAngles::GetAsString_abi_cxx11_(&local_400,&this->m_EntityOrientation);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_400._M_dataplus._M_p,local_400._M_string_length);
  DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_
            (&local_420,&this->m_EntityAppearance,&this->m_EntityType);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_420._M_dataplus._M_p,local_420._M_string_length);
  DATA_TYPE::DeadReckoningParameter::GetAsString_abi_cxx11_
            (&local_440,&this->m_DeadReckoningParameter);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_440._M_dataplus._M_p,local_440._M_string_length);
  DATA_TYPE::EntityMarking::GetAsString_abi_cxx11_(&local_460,&this->m_EntityMarking);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_460._M_dataplus._M_p,local_460._M_string_length);
  DATA_TYPE::EntityCapabilities::GetAsString_abi_cxx11_(&local_480,&this->m_EntityCapabilities);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,local_480._M_dataplus._M_p,local_480._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p) !=
      &local_4c8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_4c8._M_dataplus._M_p._1_7_,(char)local_4c8._M_dataplus._M_p),
                    local_4c8.field_2._M_allocated_capacity + 1);
  }
  if ((ostream *)local_340._0_8_ != poVar1) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  if (local_380 != local_370) {
    operator_delete(local_380,local_370[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  pKVar7 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vVariableParameters).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableParameter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pKVar7 != pKVar2) {
    do {
      (*(pKVar7->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])(local_340);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
      if ((ostream *)local_340._0_8_ != poVar1) {
        operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
      }
      pKVar7 = pKVar7 + 1;
    } while (pKVar7 != pKVar2);
  }
  pKVar3 = local_4a8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar3;
}

Assistant:

KString Entity_State_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Entity State PDU-\n"
       << "Entity ID:\n"
       << IndentString( m_EntityID.GetAsString(), 1 )
       << "Force ID:                       " << GetEnumAsStringForceID( m_ui8ForceID )  << "\n"
       << "Number Of Variable Params:  " << ( KUINT16 )m_ui8NumOfVariableParams << "\n"
       << "Entity Type:                    " << m_EntityType.GetAsString()
       << "Alternative Entity Type:        " << m_AltEntityType.GetAsString()
       << "Linear Velocity:                " << m_EntityLinearVelocity.GetAsString()
       << "Entity Location:                " << m_EntityLocation.GetAsString()
       << "Entity Orientation:             " << m_EntityOrientation.GetAsString()
       << m_EntityAppearance.GetAsString( m_EntityType )
       << m_DeadReckoningParameter.GetAsString()
       << m_EntityMarking.GetAsString()
       << m_EntityCapabilities.GetAsString();

    // Add the articulated parts
    vector<VarPrmPtr>::const_iterator citr = m_vVariableParameters.begin();
    vector<VarPrmPtr>::const_iterator citrEnd = m_vVariableParameters.end();
    for( ; citr != citrEnd; ++ citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}